

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printSSECC(MCInst *MI,uint Op,SStream *OS)

{
  byte bVar1;
  MCOperand *op;
  int64_t iVar3;
  char *s;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t Imm;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar2;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar3 = MCOperand_getImm(op);
  bVar2 = (byte)iVar3;
  bVar1 = bVar2 & 7;
  s = (char *)(ulong)bVar1;
  switch(s) {
  case (char *)0x0:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,1);
    break;
  case (char *)0x1:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,2);
    break;
  case (char *)0x2:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,3);
    break;
  case (char *)0x3:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,4);
    break;
  case (char *)0x4:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,5);
    break;
  case (char *)0x5:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,6);
    break;
  case (char *)0x6:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,7);
    break;
  case (char *)0x7:
    SStream_concat0((SStream *)(CONCAT17(bVar2,in_stack_ffffffffffffffe0) & 0x7ffffffffffffff),s);
    op_addSseCC(in_RDI,8);
  }
  in_RDI->popcode_adjust = bVar1 + 1;
  return;
}

Assistant:

static void printSSECC(MCInst *MI, unsigned Op, SStream *OS)
{
	uint8_t Imm = (uint8_t)(MCOperand_getImm(MCInst_getOperand(MI, Op)) & 7);
	switch (Imm) {
		default: break;	// never reach
		case    0: SStream_concat0(OS, "eq"); op_addSseCC(MI, X86_SSE_CC_EQ); break;
		case    1: SStream_concat0(OS, "lt"); op_addSseCC(MI, X86_SSE_CC_LT); break;
		case    2: SStream_concat0(OS, "le"); op_addSseCC(MI, X86_SSE_CC_LE); break;
		case    3: SStream_concat0(OS, "unord"); op_addSseCC(MI, X86_SSE_CC_UNORD); break;
		case    4: SStream_concat0(OS, "neq"); op_addSseCC(MI, X86_SSE_CC_NEQ); break;
		case    5: SStream_concat0(OS, "nlt"); op_addSseCC(MI, X86_SSE_CC_NLT); break;
		case    6: SStream_concat0(OS, "nle"); op_addSseCC(MI, X86_SSE_CC_NLE); break;
		case    7: SStream_concat0(OS, "ord"); op_addSseCC(MI, X86_SSE_CC_ORD); break;
	}

	MI->popcode_adjust = Imm + 1;
}